

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

int __thiscall
QPDF::outputLengthNextN(QPDF *this,int in_object,int n,NewObjTable *new_obj,ObjTable *obj)

{
  int iVar1;
  Object *pOVar2;
  NewObject *pNVar3;
  allocator<char> local_a1;
  string local_a0;
  long local_80;
  qpdf_offset_t l;
  long lStack_70;
  int i;
  qpdf_offset_t length;
  allocator<char> local_51;
  string local_50;
  int local_30;
  int local_2c;
  int last;
  int first;
  ObjTable *obj_local;
  NewObjTable *new_obj_local;
  int n_local;
  int in_object_local;
  QPDF *this_local;
  
  _last = obj;
  obj_local = (ObjTable *)new_obj;
  new_obj_local._0_4_ = n;
  new_obj_local._4_4_ = in_object;
  _n_local = this;
  pOVar2 = ObjTable<QPDFWriter::Object>::operator[]
                     (&obj->super_ObjTable<QPDFWriter::Object>,in_object);
  local_2c = pOVar2->renumber;
  local_30 = local_2c + (int)new_obj_local;
  if (local_2c < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "found object that is not renumbered while writing linearization data",&local_51);
    stopOnError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  lStack_70 = 0;
  for (l._4_4_ = local_2c; l._4_4_ < local_30; l._4_4_ = l._4_4_ + 1) {
    pNVar3 = ObjTable<QPDFWriter::NewObject>::operator[]
                       ((ObjTable<QPDFWriter::NewObject> *)obj_local,l._4_4_);
    local_80 = pNVar3->length;
    if (local_80 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,
                 "found item with unknown length while writing linearization data",&local_a1);
      stopOnError(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
    lStack_70 = local_80 + lStack_70;
  }
  iVar1 = toI<long_long>(&stack0xffffffffffffff90);
  return iVar1;
}

Assistant:

int
QPDF::outputLengthNextN(
    int in_object, int n, QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    // Figure out the length of a series of n consecutive objects in the output file starting with
    // whatever object in_object from the input file mapped to.

    int first = obj[in_object].renumber;
    int last = first + n;
    if (first <= 0) {
        stopOnError("found object that is not renumbered while writing linearization data");
    }
    qpdf_offset_t length = 0;
    for (int i = first; i < last; ++i) {
        auto l = new_obj[i].length;
        if (l == 0) {
            stopOnError("found item with unknown length while writing linearization data");
        }
        length += l;
    }
    return toI(length);
}